

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::IfConversion::SplatCondition
          (IfConversion *this,Vector *vec_data_ty,uint32_t cond,InstructionBuilder *builder)

{
  IRContext *this_00;
  uint32_t uVar1;
  Instruction *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  Bool bool_ty;
  Vector bool_vec_ty;
  allocator_type local_9d;
  uint32_t local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  Type local_80;
  Vector local_58;
  
  local_80.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.kind_ = kBool;
  local_80._vptr_Type = (_func_int **)&PTR__Type_00b04020;
  local_9c = cond;
  analysis::Vector::Vector(&local_58,&local_80,vec_data_ty->count_);
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_00);
  }
  uVar1 = analysis::TypeManager::GetTypeInstruction
                    ((this_00->type_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                     _M_head_impl,&local_58.super_Type);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_98,(ulong)vec_data_ty->count_,&local_9c,&local_9d);
  this_01 = InstructionBuilder::AddCompositeConstruct(builder,uVar1,&local_98);
  uVar1 = 0;
  if (this_01->has_result_id_ == true) {
    uVar1 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
  }
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_58.super_Type._vptr_Type = (_func_int **)&PTR__Type_00b031e8;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_58.super_Type.decorations_);
  local_80._vptr_Type = (_func_int **)&PTR__Type_00b031e8;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_80.decorations_);
  return uVar1;
}

Assistant:

uint32_t IfConversion::SplatCondition(analysis::Vector* vec_data_ty,
                                      uint32_t cond,
                                      InstructionBuilder* builder) {
  // If the data inputs to OpSelect are vectors, the condition for
  // OpSelect must be a boolean vector with the same number of
  // components. So splat the condition for the branch into a vector
  // type.
  analysis::Bool bool_ty;
  analysis::Vector bool_vec_ty(&bool_ty, vec_data_ty->element_count());
  uint32_t bool_vec_id =
      context()->get_type_mgr()->GetTypeInstruction(&bool_vec_ty);
  std::vector<uint32_t> ids(vec_data_ty->element_count(), cond);
  return builder->AddCompositeConstruct(bool_vec_id, ids)->result_id();
}